

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

void uc_init_ppc64(uc_struct_conflict10 *uc)

{
  uc_struct_conflict10 *uc_local;
  
  uc->reg_read_ppc = reg_read_ppc64;
  uc->reg_write_ppc = reg_write_ppc64;
  uc->reg_reset = reg_reset;
  uc->release = ppc_release;
  uc->set_pc = ppc_set_pc;
  uc->get_pc = ppc_get_pc;
  uc->cpus_init = ppc_cpus_init;
  uc->cpu_context_size = 0x138a0;
  uc_common_init(uc);
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->release = ppc_release;
    uc->set_pc = ppc_set_pc;
    uc->get_pc = ppc_get_pc;
    uc->cpus_init = ppc_cpus_init;
    uc->cpu_context_size = offsetof(CPUPPCState, uc);
    uc_common_init(uc);
}